

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonConvertTextToBlob(JsonParse *pParse,sqlite3_context *pCtx)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  char *zJson;
  int i;
  u32 in_stack_0000002c;
  JsonParse *in_stack_00000030;
  char *z;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  z = *(char **)(in_RDI + 0x10);
  iVar1 = jsonTranslateTextToBlob(in_stack_00000030,in_stack_0000002c);
  if (*(char *)(in_RDI + 0x2f) != '\0') {
    iVar1 = -1;
  }
  if (0 < iVar1) {
    while (""[(byte)z[iVar1]] != '\0') {
      iVar1 = iVar1 + 1;
    }
    if (z[iVar1] != '\0') {
      iVar2 = json5Whitespace(z + iVar1);
      iVar1 = iVar2 + iVar1;
      if (z[iVar1] != '\0') {
        if (in_RSI != 0) {
          sqlite3_result_error((sqlite3_context *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),z,0);
        }
        jsonParseReset((JsonParse *)0x23274b);
        return 1;
      }
      *(undefined1 *)(in_RDI + 0x31) = 1;
    }
  }
  if (iVar1 < 1) {
    if (in_RSI != 0) {
      if (*(char *)(in_RDI + 0x2f) == '\0') {
        sqlite3_result_error((sqlite3_context *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),z,0);
      }
      else {
        sqlite3_result_error_nomem((sqlite3_context *)0x232784);
      }
    }
    jsonParseReset((JsonParse *)0x2327a8);
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int jsonConvertTextToBlob(
  JsonParse *pParse,           /* Initialize and fill this JsonParse object */
  sqlite3_context *pCtx        /* Report errors here */
){
  int i;
  const char *zJson = pParse->zJson;
  i = jsonTranslateTextToBlob(pParse, 0);
  if( pParse->oom ) i = -1;
  if( i>0 ){
#ifdef SQLITE_DEBUG
    assert( pParse->iDepth==0 );
    if( sqlite3Config.bJsonSelfcheck ){
      assert( jsonbValidityCheck(pParse, 0, pParse->nBlob, 0)==0 );
    }
#endif
    while( jsonIsspace(zJson[i]) ) i++;
    if( zJson[i] ){
      i += json5Whitespace(&zJson[i]);
      if( zJson[i] ){
        if( pCtx ) sqlite3_result_error(pCtx, "malformed JSON", -1);
        jsonParseReset(pParse);
        return 1;
      }
      pParse->hasNonstd = 1;
    }
  }
  if( i<=0 ){
    if( pCtx!=0 ){
      if( pParse->oom ){
        sqlite3_result_error_nomem(pCtx);
      }else{
        sqlite3_result_error(pCtx, "malformed JSON", -1);
      }
    }
    jsonParseReset(pParse);
    return 1;
  }
  return 0;
}